

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tbx.c
# Opt level: O0

char ** tbx_seqnames(tbx_t *tbx,int *n)

{
  uint uVar1;
  uint *puVar2;
  int iVar3;
  uint local_3c;
  khint_t k;
  char **names;
  int m;
  int tid;
  kh_s2i_t *d;
  int *n_local;
  tbx_t *tbx_local;
  
  puVar2 = (uint *)tbx->dict;
  if (puVar2 == (uint *)0x0) {
    *n = 0;
    tbx_local = (tbx_t *)0x0;
  }
  else {
    uVar1 = puVar2[1];
    tbx_local = (tbx_t *)calloc((long)(int)uVar1,8);
    for (local_3c = 0; local_3c < *puVar2; local_3c = local_3c + 1) {
      if ((*(uint *)(*(long *)(puVar2 + 4) + (ulong)(local_3c >> 4) * 4) >>
           (sbyte)((local_3c & 0xf) << 1) & 3) == 0) {
        iVar3 = (int)*(undefined8 *)(*(long *)(puVar2 + 8) + (ulong)local_3c * 8);
        if ((int)uVar1 <= iVar3) {
          __assert_fail("tid<m",
                        "/workspace/llm4binary/github/license_c_cmakelists/gatoravi[P]bam-parser-tutorial/htslib/tbx.c"
                        ,0x137,"const char **tbx_seqnames(tbx_t *, int *)");
        }
        *(undefined8 *)(&(tbx_local->conf).preset + (long)iVar3 * 2) =
             *(undefined8 *)(*(long *)(puVar2 + 6) + (ulong)local_3c * 8);
      }
    }
    for (names._4_4_ = 0; names._4_4_ < (int)uVar1; names._4_4_ = names._4_4_ + 1) {
      if (*(long *)(&(tbx_local->conf).preset + (long)names._4_4_ * 2) == 0) {
        __assert_fail("names[tid]",
                      "/workspace/llm4binary/github/license_c_cmakelists/gatoravi[P]bam-parser-tutorial/htslib/tbx.c"
                      ,0x13c,"const char **tbx_seqnames(tbx_t *, int *)");
      }
    }
    *n = uVar1;
  }
  return (char **)tbx_local;
}

Assistant:

const char **tbx_seqnames(tbx_t *tbx, int *n)
{
    khash_t(s2i) *d = (khash_t(s2i)*)tbx->dict;
    if (d == NULL)
    {
        *n = 0;
        return NULL;
    }
    int tid, m = kh_size(d);
    const char **names = (const char**) calloc(m,sizeof(const char*));
    khint_t k;
    for (k=kh_begin(d); k<kh_end(d); k++)
    {
        if ( !kh_exist(d,k) ) continue;
        tid = kh_val(d,k);
        assert( tid<m );
        names[tid] = kh_key(d,k);
    }
    // sanity check: there should be no gaps
    for (tid=0; tid<m; tid++)
        assert(names[tid]);
    *n = m;
    return names;
}